

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O2

void * lyplg_type_print_bits
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  lysc_type_bits *type;
  long lVar1;
  LY_ERR LVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  if (format == LY_VALUE_LYB) {
    type = (lysc_type_bits *)value->realtype;
    *dynamic = '\0';
    if (value_len != (size_t *)0x0) {
      sVar3 = lyplg_type_bits_bitmap_size(type);
      *value_len = sVar3;
    }
    return (void *)(value->field_2).dec64;
  }
  if (value->_canonical == (char *)0x0) {
    lVar1 = *(long *)((long)&value->field_2 + 8);
    pcVar5 = strdup("");
    if (pcVar5 == (char *)0x0) {
      return (void *)0x0;
    }
    sVar4 = 0;
    uVar8 = 0;
    while( true ) {
      if (lVar1 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ulong *)(lVar1 + -8);
      }
      if (uVar6 <= uVar8) break;
      sVar7 = strlen((char *)**(undefined8 **)(lVar1 + uVar8 * 8));
      if (sVar4 == 0) {
        pcVar5 = (char *)ly_realloc(pcVar5,sVar7 + 1);
        if (pcVar5 == (char *)0x0) {
          return (void *)0x0;
        }
        strcpy(pcVar5,(char *)**(undefined8 **)(lVar1 + uVar8 * 8));
        sVar4 = strlen(pcVar5);
      }
      else {
        pcVar5 = (char *)ly_realloc(pcVar5,sVar7 + sVar4 + 2);
        if (pcVar5 == (char *)0x0) {
          return (void *)0x0;
        }
        sprintf(pcVar5 + sVar4," %s",**(undefined8 **)(lVar1 + uVar8 * 8));
        sVar7 = strlen((char *)**(undefined8 **)(lVar1 + uVar8 * 8));
        sVar4 = sVar4 + sVar7 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    LVar2 = lydict_insert_zc(ctx,pcVar5,&value->_canonical);
    if (LVar2 != LY_SUCCESS) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_print_bits");
      return (void *)0x0;
    }
  }
  if (dynamic != (ly_bool *)0x0) {
    *dynamic = '\0';
  }
  pcVar5 = value->_canonical;
  if (value_len != (size_t *)0x0) {
    sVar4 = strlen(pcVar5);
    *value_len = sVar4;
  }
  return pcVar5;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_bits(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)value->realtype;
    struct lyd_value_bits *val;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        *dynamic = 0;
        if (value_len) {
            *value_len = lyplg_type_bits_bitmap_size(type_bits);
        }
        return val->bitmap;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        /* get the canonical value */
        if (bits_items2canon(val->items, &ret)) {
            return NULL;
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}